

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SaturationAlgorithm.cpp
# Opt level: O0

void __thiscall
Saturation::SaturationAlgorithm::addInputSOSClause(SaturationAlgorithm *this,Clause *cl)

{
  long *plVar1;
  bool bVar2;
  int iVar3;
  ImmediateSimplificationEngine *pIVar4;
  undefined4 extraout_var;
  Clause *pCVar5;
  fd_set *in_RCX;
  Clause *in_RSI;
  Clause *in_RDI;
  fd_set *in_R8;
  timeval *in_R9;
  LiteralSelector *sosSelector;
  Clause *simplCl;
  Clause *in_stack_00000028;
  SaturationAlgorithm *in_stack_00000030;
  bool in_stack_0000004f;
  Clause *in_stack_00000050;
  uint in_stack_0000005c;
  Clause **in_stack_00000060;
  Clause *in_stack_00000068;
  SaturationAlgorithm *in_stack_00000070;
  SaturationAlgorithm *in_stack_ffffffffffffffe0;
  Clause *local_10;
  
  Kernel::Clause::incRefCnt(in_RSI);
  onNewClause(in_stack_00000030,in_stack_00000028);
  local_10 = in_RSI;
  do {
    pIVar4 = Lib::ScopedPtr<Inferences::ImmediateSimplificationEngine>::operator->
                       ((ScopedPtr<Inferences::ImmediateSimplificationEngine> *)
                        &in_RDI[1].super_Unit._inference._ptr1);
    iVar3 = (*(pIVar4->super_InferenceEngine)._vptr_InferenceEngine[6])(pIVar4,local_10);
    pCVar5 = (Clause *)CONCAT44(extraout_var,iVar3);
    if (pCVar5 == local_10) {
      bVar2 = Kernel::Clause::isEmpty(local_10);
      if (bVar2) {
        addNewClause(in_stack_ffffffffffffffe0,in_RDI);
      }
      else {
        pCVar5 = (Clause *)getSosLiteralSelector((SaturationAlgorithm *)sosSelector);
        Kernel::LiteralSelector::select
                  ((LiteralSelector *)pCVar5,(int)local_10,(fd_set *)0x0,in_RCX,in_R8,in_R9);
        Kernel::Clause::setStore(pCVar5,(Store)((ulong)in_RDI >> 0x20));
        *(int *)(DAT_01333840 + 0x1dc) = *(int *)(DAT_01333840 + 0x1dc) + 1;
        plVar1 = *(long **)&in_RDI[1].super_Unit._inference;
        (**(code **)(*plVar1 + 0x10))(plVar1,local_10);
        (**(code **)(*(long *)&in_RDI->super_Unit + 0x38))(in_RDI,local_10);
      }
LAB_00ad02e8:
      Kernel::Clause::decRefCnt((Clause *)0xad02f2);
      return;
    }
    if (pCVar5 == (Clause *)0x0) {
      onClauseReduction(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
                        in_stack_00000050,in_stack_0000004f);
      goto LAB_00ad02e8;
    }
    Kernel::Clause::incRefCnt(pCVar5);
    Kernel::Clause::decRefCnt((Clause *)0xad021d);
    onNewClause(in_stack_00000030,in_stack_00000028);
    in_R9 = (timeval *)0x1;
    in_R8 = (fd_set *)0x0;
    in_RCX = (fd_set *)0x1;
    onClauseReduction(in_stack_00000070,in_stack_00000068,in_stack_00000060,in_stack_0000005c,
                      in_stack_00000050,in_stack_0000004f);
    local_10 = pCVar5;
  } while( true );
}

Assistant:

void SaturationAlgorithm::addInputSOSClause(Clause* cl)
{
  ASS_EQ(toNumber(cl->inputType()),toNumber(UnitInputType::AXIOM));

  // we add an extra reference until the clause is added to some container, so that
  // it won't get deleted during some code e.g. in the onNewClause handler
  cl->incRefCnt();

  onNewClause(cl);

simpl_start:

  Clause *simplCl = _immediateSimplifier->simplify(cl);
  if (simplCl != cl) {
    if (!simplCl) {
      onClauseReduction(cl, 0, 0, 0);
      goto fin;
    }

    simplCl->incRefCnt();
    cl->decRefCnt(); // now cl is referenced from simplCl, so after removing the extra reference, it won't be destroyed

    onNewClause(simplCl);
    onClauseReduction(cl, &simplCl, 1, 0);
    cl = simplCl;
    goto simpl_start;
  }

  if (cl->isEmpty()) {
    addNewClause(cl);
    goto fin;
  }

  ASS(!cl->numSelected());
  {
    LiteralSelector& sosSelector = getSosLiteralSelector();
    sosSelector.select(cl);
  }

  cl->setStore(Clause::ACTIVE);
  env.statistics->activeClauses++;
  _active->add(cl);

  onSOSClauseAdded(cl);

fin:
  cl->decRefCnt();
}